

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_ResampleGeneric
               (float *dCache,float *resampleCache,uint64_t *resampleOffset,uint64_t resampleStep,
               uint64_t toResample,uint8_t channels)

{
  ulong uVar1;
  uint64_t cur;
  uint32_t j;
  uint32_t i;
  uint8_t channels_local;
  uint64_t toResample_local;
  uint64_t resampleStep_local;
  uint64_t *resampleOffset_local;
  float *resampleCache_local;
  float *dCache_local;
  
  uVar1 = *resampleOffset;
  resampleCache_local = resampleCache;
  dCache_local = dCache;
  for (i = 0; cur = uVar1 & 0xffffffff, i < toResample; i = i + 1) {
    for (j = 0; j < channels; j = j + 1) {
      *resampleCache_local =
           (float)((double)(dCache_local[j + channels] - dCache_local[j]) *
                   ((double)cur * 2.3283064365386963e-10 + 0.0) + (double)dCache_local[j]);
      resampleCache_local = resampleCache_local + 1;
    }
    *resampleOffset = resampleStep + *resampleOffset;
    uVar1 = resampleStep + cur;
    dCache_local = dCache_local + (uVar1 >> 0x20) * (ulong)channels;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_ResampleGeneric(
	float *restrict dCache,
	float *restrict resampleCache,
	uint64_t *resampleOffset,
	uint64_t resampleStep,
	uint64_t toResample,
	uint8_t channels
) {
	uint32_t i, j;
	uint64_t cur = *resampleOffset & FIXED_FRACTION_MASK;
	for (i = 0; i < toResample; i += 1)
	{
		for (j = 0; j < channels; j += 1)
		{
			/* lerp, then convert to float value */
			*resampleCache++ = (float) (
				dCache[j] +
				(dCache[j + channels] - dCache[j]) *
				FIXED_TO_DOUBLE(cur)
			);
		}

		/* Increment fraction offset by the stepping value */
		*resampleOffset += resampleStep;
		cur += resampleStep;

		/* Only increment the sample offset by integer values.
		 * Sometimes this will be 0 until cur accumulates
		 * enough steps, especially for "slow" rates.
		 */
		dCache += (cur >> FIXED_PRECISION) * channels;

		/* Now that any integer has been added, drop it.
		 * The offset pointer will preserve the total.
		 */
		cur &= FIXED_FRACTION_MASK;
	}
}